

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_renderbuffers.cpp
# Opt level: O3

void __thiscall FGLRenderBuffers::ClearFrameBuffer(FGLRenderBuffers *this,bool stencil,bool depth)

{
  undefined3 in_register_00000011;
  undefined7 in_register_00000031;
  GLboolean scissorEnabled;
  GLint stencilValue;
  GLdouble depthValue;
  GLboolean local_3d;
  GLint local_3c;
  GLdouble local_38;
  
  (*_ptrc_glGetBooleanv)(0xc11,&local_3d);
  (*_ptrc_glGetIntegerv)(0xb91,&local_3c);
  (*_ptrc_glGetDoublev)(0xb73,&local_38);
  (*_ptrc_glDisable)(0xc11);
  (*_ptrc_glClearColor)(0.0,0.0,0.0,0.0);
  (*_ptrc_glClearDepth)(0.0);
  (*_ptrc_glClearStencil)(0);
  (*_ptrc_glClear)(CONCAT31(in_register_00000011,depth) * 0x100 +
                   (int)CONCAT71(in_register_00000031,stencil) * 0x400 + 0x4000);
  (*_ptrc_glClearStencil)(local_3c);
  (*_ptrc_glClearDepth)(local_38);
  if (local_3d != '\0') {
    (*_ptrc_glEnable)(0xc11);
  }
  return;
}

Assistant:

void FGLRenderBuffers::ClearFrameBuffer(bool stencil, bool depth)
{
	GLboolean scissorEnabled;
	GLint stencilValue;
	GLdouble depthValue;
	glGetBooleanv(GL_SCISSOR_TEST, &scissorEnabled);
	glGetIntegerv(GL_STENCIL_CLEAR_VALUE, &stencilValue);
	glGetDoublev(GL_DEPTH_CLEAR_VALUE, &depthValue);
	glDisable(GL_SCISSOR_TEST);
	glClearColor(0.0, 0.0, 0.0, 0.0);
	glClearDepth(0.0);
	glClearStencil(0);
	GLenum flags = GL_COLOR_BUFFER_BIT;
	if (stencil)
		flags |= GL_STENCIL_BUFFER_BIT;
	if (depth)
		flags |= GL_DEPTH_BUFFER_BIT;
	glClear(flags);
	glClearStencil(stencilValue);
	glClearDepth(depthValue);
	if (scissorEnabled)
		glEnable(GL_SCISSOR_TEST);
}